

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O3

void __thiscall SBarInfo::ParseMugShotBlock(SBarInfo *this,FScanner *sc,FMugShotState *state)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  char *__s;
  FMugShotFrame frame;
  FString local_50;
  FMugShotFrame local_48;
  
  FScanner::MustGetToken(sc,0x7b);
  bVar1 = FScanner::CheckToken(sc,0x7d);
  if (!bVar1) {
    do {
      FMugShotFrame::FMugShotFrame(&local_48);
      bVar1 = FScanner::CheckToken(sc,0x7b);
      do {
        FScanner::MustGetToken(sc,0x101);
        __s = sc->String;
        sVar3 = strlen(__s);
        if (5 < sVar3) {
          FScanner::ScriptError(sc,"MugShot frames cannot exceed 5 characters.");
          __s = sc->String;
        }
        FString::FString(&local_50,__s);
        TArray<FString,_FString>::Grow(&local_48.Graphic,1);
        FString::AttachToOther(local_48.Graphic.Array + local_48.Graphic.Count,&local_50);
        local_48.Graphic.Count = local_48.Graphic.Count + 1;
        FString::~FString(&local_50);
        if (!bVar1) goto LAB_004be7ac;
        bVar2 = FScanner::CheckToken(sc,0x2c);
      } while (bVar2);
      FScanner::MustGetToken(sc,0x7d);
LAB_004be7ac:
      bVar1 = FScanner::CheckToken(sc,0x2d);
      FScanner::MustGetToken(sc,0x104);
      local_48.Delay = -sc->Number;
      if (!bVar1) {
        local_48.Delay = sc->Number;
      }
      FScanner::MustGetToken(sc,0x3b);
      TArray<FMugShotFrame,_FMugShotFrame>::Push(&state->Frames,&local_48);
      FMugShotFrame::~FMugShotFrame(&local_48);
      bVar1 = FScanner::CheckToken(sc,0x7d);
    } while (!bVar1);
  }
  return;
}

Assistant:

void SBarInfo::ParseMugShotBlock(FScanner &sc, FMugShotState &state)
{
	sc.MustGetToken('{');
	while(!sc.CheckToken('}'))
	{
		FMugShotFrame frame;
		bool multiframe = false;
		if(sc.CheckToken('{'))
			multiframe = true;
		do
		{
			sc.MustGetToken(TK_Identifier);
			if(strlen(sc.String) > 5)
				sc.ScriptError("MugShot frames cannot exceed 5 characters.");
			frame.Graphic.Push(sc.String);
		}
		while(multiframe && sc.CheckToken(','));
		if(multiframe)
			sc.MustGetToken('}');
		bool negative = sc.CheckToken('-');
		sc.MustGetToken(TK_IntConst);
		frame.Delay = (negative ? -1 : 1)*sc.Number;
		sc.MustGetToken(';');
		state.Frames.Push(frame);
	}
}